

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

ON__UINT64 __thiscall
ON_SN_BLOCK::ActiveElementEstimate(ON_SN_BLOCK *this,ON__UINT64 sn0,ON__UINT64 sn1)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = this->m_count - this->m_purged;
  if (uVar1 == 0) {
    return 0;
  }
  if (sn0 < this->m_sn0) {
    sn0 = this->m_sn0;
  }
  if (this->m_sn1 < sn1) {
    sn1 = this->m_sn1;
  }
  uVar2 = (sn1 - sn0) + 1;
  if (uVar1 <= uVar2) {
    uVar2 = (ulong)uVar1;
  }
  return uVar2;
}

Assistant:

ON__UINT64 ON_SN_BLOCK::ActiveElementEstimate(ON__UINT64 sn0, ON__UINT64 sn1) const
{
  ON__UINT64 c = m_count-m_purged;
  if ( c > 0 )
  {
    if ( sn0 < m_sn0 )
      sn0 = m_sn0;
    if ( sn1 > m_sn1 )
      sn1 = m_sn1;
    sn1 -= sn0;
    sn1++;
    if (c > sn1)
      c = sn1;
  }
  return c;
}